

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockMgr::GetFileShareModeForFile
          (CSharedMemoryFileLockMgr *this,LPCSTR szFileName,DWORD *pdwShareMode)

{
  bool bVar1;
  LPVOID local_38;
  SHMFILELOCKS *fileLocks;
  SHMPTR shmFileLocks;
  DWORD *pDStack_20;
  PAL_ERROR palError;
  DWORD *pdwShareMode_local;
  LPCSTR szFileName_local;
  CSharedMemoryFileLockMgr *this_local;
  
  shmFileLocks._4_4_ = 0;
  *pdwShareMode = 0xffffffff;
  fileLocks = (SHMFILELOCKS *)0x0;
  pDStack_20 = pdwShareMode;
  pdwShareMode_local = (DWORD *)szFileName;
  szFileName_local = (LPCSTR)this;
  SHMLock();
  shmFileLocks._4_4_ = FILEGetSHMFileLocks((LPCSTR)pdwShareMode_local,(SHMPTR *)&fileLocks,1);
  if ((shmFileLocks._4_4_ == 0) && (fileLocks != (SHMFILELOCKS *)0x0)) {
    if (fileLocks == (SHMFILELOCKS *)0x0) {
      local_38 = (LPVOID)0x0;
      bVar1 = true;
    }
    else {
      local_38 = SHMPtrToPtr((SHMPTR)fileLocks);
      bVar1 = local_38 != (LPVOID)0x0;
    }
    if (bVar1) {
      *pDStack_20 = *(DWORD *)((long)local_38 + 0x28);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","GetFileShareModeForFile",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x11e);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      shmFileLocks._4_4_ = 0x54f;
    }
  }
  if (fileLocks != (SHMFILELOCKS *)0x0) {
    FILECleanUpLockedRgn((SHMPTR)fileLocks,0,(PVOID)0x0);
  }
  SHMRelease();
  return shmFileLocks._4_4_;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockMgr::GetFileShareModeForFile(
   LPCSTR szFileName,
   DWORD* pdwShareMode)
{
    PAL_ERROR palError = NO_ERROR;
    *pdwShareMode = SHARE_MODE_NOT_INITALIZED;
    SHMPTR shmFileLocks = SHMNULL;
    SHMFILELOCKS* fileLocks = NULL;

    SHMLock();

    palError = FILEGetSHMFileLocks(szFileName, &shmFileLocks, TRUE);
    if (NO_ERROR != palError || shmFileLocks == SHMNULL)
    {
        goto GetLockControllerForFileExit;
    }

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto GetLockControllerForFileExit;
    }

    *pdwShareMode = fileLocks->share_mode;

GetLockControllerForFileExit:

    if (SHMNULL != shmFileLocks)
    {
      FILECleanUpLockedRgn(
                shmFileLocks,
                0,
                NULL
                );
    }

    SHMRelease();

    return palError;
}